

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  uint uVar5;
  UnitTest *pUVar6;
  long *plVar7;
  undefined8 *puVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  void *__addr;
  int *piVar9;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  size_type *psVar13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _union_1457 extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  _union_1457 extraout_RDX_06;
  ulong uVar17;
  undefined8 uVar18;
  const_iterator __position;
  _union_1457 _Var19;
  size_t __len;
  int pipe_fd [2];
  string filter_flag;
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_210;
  int local_20c;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  int local_1c4;
  string local_1c0;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  string local_180;
  _union_1457 local_160;
  long local_158;
  size_type local_150;
  undefined8 uStack_148;
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  pUVar6 = UnitTest::GetInstance();
  pIVar1 = (pUVar6->impl_->internal_run_death_test_flag_).ptr_;
  local_1c4 = (pUVar6->impl_->current_test_info_->result_).death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  do {
    iVar3 = pipe(&local_210);
    bVar2 = IsTrue(iVar3 != -1);
    if (!bVar2) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar8[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if (local_2d0 == paVar15) {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c0._8_8_ = plVar7[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2c8 = plVar7[1];
      *plVar7 = (long)paVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_270._M_dataplus._M_p._0_4_ = 0x459;
      StreamableToString<int>(&local_290,(int *)&local_270);
      uVar18 = 0xf;
      if (local_2d0 != &local_2c0) {
        uVar18 = local_2c0._M_allocated_capacity;
      }
      _Var19.sa_handler = (__sighandler_t)&local_290.field_2;
      if ((ulong)uVar18 < local_290._M_string_length + local_2c8) {
        uVar18 = 0xf;
        if ((__sighandler_t)local_290._M_dataplus._M_p != _Var19.sa_handler) {
          uVar18 = local_290.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_290._M_string_length + local_2c8) goto LAB_0011a2d3;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
      }
      else {
LAB_0011a2d3:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
      }
      local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
      local_c8.sa_handler = (__sighandler_t)*puVar8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.sa_handler == paVar15) {
        local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_b8[0]._8_8_ = puVar8[3];
        local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
      }
      else {
        local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
      }
      local_c0 = (undefined1  [8])puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      local_160.sa_handler = (__sighandler_t)*puVar8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler == paVar15) {
        local_150 = paVar15->_M_allocated_capacity;
        uStack_148 = puVar8[3];
        local_160.sa_handler = (__sighandler_t)&local_150;
      }
      else {
        local_150 = paVar15->_M_allocated_capacity;
      }
      local_158 = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort((string *)&local_160);
      puVar8 = extraout_RAX;
      local_160 = extraout_RDX;
      goto LAB_0011b1ae;
    }
    bVar2 = AlwaysTrue();
  } while (!bVar2);
LAB_00118ea3:
  iVar3 = fcntl(local_20c,2,0);
  bVar2 = IsTrue(iVar3 != -1);
  if (bVar2) goto code_r0x00118ece;
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x45c;
  StreamableToString<int>(&local_290,(int *)&local_270);
  uVar18 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar18 = local_2c0._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_290._M_string_length + local_2c8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar18 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_290._M_string_length + local_2c8) goto LAB_0011a377;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_0011a377:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
  _Var19.sa_handler = (__sighandler_t)(local_c0 + 8);
  local_c8.sa_handler = (__sighandler_t)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar15) {
    local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = _Var19.sa_handler;
  }
  else {
    local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
  }
  local_c0 = (undefined1  [8])puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  local_160.sa_handler = (__sighandler_t)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler == paVar15) {
    local_150 = paVar15->_M_allocated_capacity;
    uStack_148 = puVar8[3];
    local_160.sa_handler = (__sighandler_t)&local_150;
  }
  else {
LAB_0011b1ae:
    local_150 = paVar15->_M_allocated_capacity;
  }
  local_158 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  puVar8 = extraout_RAX_00;
  local_2d0 = extraout_RDX_00;
  goto LAB_0011b1e5;
code_r0x00118ece:
  bVar2 = AlwaysTrue();
  if (bVar2) goto code_r0x00118ed7;
  goto LAB_00118ea3;
code_r0x00118ed7:
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = &local_300;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar7[3];
  }
  else {
    local_300 = *puVar10;
    local_310 = (ulong *)*plVar7;
  }
  local_308 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = &local_2c0;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = plVar7[3];
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7;
  }
  local_2c8 = plVar7[1];
  *plVar7 = (long)paVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2b0._M_string_length = plVar7[1];
  *plVar7 = (long)paVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if ((__sighandler_t)*plVar7 == p_Var11) {
    local_b8[0]._0_8_ = *(undefined8 *)p_Var11;
    local_b8[0]._8_8_ = plVar7[3];
  }
  else {
    local_b8[0]._0_8_ = *(undefined8 *)p_Var11;
    local_c8.sa_handler = (__sighandler_t)*plVar7;
  }
  local_c0 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  _Var19.sa_handler = (__sighandler_t)&local_150;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_150 = paVar15->_M_allocated_capacity;
    uStack_148 = puVar8[3];
    local_160.sa_handler = _Var19.sa_handler;
  }
  else {
    local_150 = paVar15->_M_allocated_capacity;
    local_160.sa_handler = (__sighandler_t)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_208 = &local_1f8;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_1f8 = *plVar12;
    lStack_1f0 = plVar7[3];
  }
  else {
    local_1f8 = *plVar12;
    local_208 = (long *)*plVar7;
  }
  local_200 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_160.sa_handler != _Var19.sa_handler) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)(local_c0 + 8)) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = plVar7[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_250._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270.field_2._8_8_ = plVar7[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  psVar13 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_290.field_2._M_allocated_capacity = *psVar13;
    local_290.field_2._8_8_ = plVar7[3];
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar13;
    local_290._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_290._M_string_length = plVar7[1];
  *plVar7 = (long)psVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = plVar7[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
    local_2f0 = (ulong *)*plVar7;
  }
  local_2e8 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = &local_300;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar7[3];
  }
  else {
    local_300 = *puVar10;
    local_310 = (ulong *)*plVar7;
  }
  local_308 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_1e8,&this->line_);
  uVar17 = 0xf;
  if (local_310 != &local_300) {
    uVar17 = local_300;
  }
  if (uVar17 < local_1e8._M_string_length + local_308) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar18 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_1e8._M_string_length + local_308) goto LAB_00119421;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00119421:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_2d0 = &local_2c0;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  StreamableToString<int>(&local_1c0,&local_1c4);
  uVar17 = CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length) +
           local_2b0._M_string_length;
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    uVar18 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < uVar17) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar18 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < uVar17) goto LAB_00119548;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1c0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_00119548:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_1c0._M_dataplus._M_p);
  }
  local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
  p_Var11 = (__sighandler_t)(puVar8 + 2);
  if ((__sighandler_t)*puVar8 == p_Var11) {
    local_b8[0]._0_8_ = *(undefined8 *)p_Var11;
    local_b8[0]._8_8_ = puVar8[3];
  }
  else {
    local_b8[0]._0_8_ = *(undefined8 *)p_Var11;
    local_c8.sa_handler = (__sighandler_t)*puVar8;
  }
  local_c0 = (undefined1  [8])puVar8[1];
  *puVar8 = p_Var11;
  puVar8[1] = 0;
  *p_Var11 = (__sighandler_t)0x0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_150 = paVar15->_M_allocated_capacity;
    uStack_148 = puVar8[3];
    local_160.sa_handler = _Var19.sa_handler;
  }
  else {
    local_150 = paVar15->_M_allocated_capacity;
    local_160.sa_handler = (__sighandler_t)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  StreamableToString<int>(&local_180,&local_20c);
  uVar17 = 0xf;
  if (local_160.sa_handler != _Var19.sa_handler) {
    uVar17 = local_150;
  }
  if (uVar17 < local_158 + local_180._M_string_length) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_180._M_dataplus._M_p._4_4_,local_180._M_dataplus._M_p._0_4_) !=
        &local_180.field_2) {
      uVar18 = local_180.field_2._M_allocated_capacity;
    }
    if (local_158 + local_180._M_string_length <= (ulong)uVar18) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_160);
      goto LAB_001196a9;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_160,
                      (ulong)CONCAT44(local_180._M_dataplus._M_p._4_4_,
                                      local_180._M_dataplus._M_p._0_4_));
LAB_001196a9:
  local_1a0 = &local_190;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_190 = *plVar7;
    uStack_188 = puVar8[3];
  }
  else {
    local_190 = *plVar7;
    local_1a0 = (long *)*puVar8;
  }
  local_198 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_180._M_dataplus._M_p._4_4_,local_180._M_dataplus._M_p._0_4_) !=
      &local_180.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_180._M_dataplus._M_p._4_4_,local_180._M_dataplus._M_p._0_4_),
                    local_180.field_2._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != _Var19.sa_handler) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)(local_c0 + 8)) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  Arguments::Arguments((Arguments *)&local_1e8);
  __x = GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_160,__x);
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_160);
  __position._M_current = (char **)(local_1e8._M_string_length - 8);
  local_160.sa_handler = (__sighandler_t)strdup((char *)local_208);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,__position,
             (value_type *)&local_160.sa_handler);
  local_160.sa_handler = (__sighandler_t)strdup((char *)local_1a0);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,
             (char **)(local_1e8._M_string_length - 8),(value_type *)&local_160.sa_handler);
  local_160.sa_handler = _Var19.sa_handler;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if (local_160.sa_handler != _Var19.sa_handler) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  CaptureStderr();
  fflush((FILE *)0x0);
  local_1c0._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
  local_1c0._M_string_length._0_4_ = local_210;
  memset(&local_c8,0,0x98);
  sigemptyset((sigset_t *)local_c0);
  local_c8 = (_union_1457)0x1;
  do {
    while (iVar3 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_160), iVar3 == -1) {
      piVar9 = __errno_location();
      if (*piVar9 != 4) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"CHECK failed: File ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_270._M_dataplus._M_p = (pointer)*plVar7;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)local_270._M_dataplus._M_p == puVar10) {
          local_270.field_2._M_allocated_capacity = *puVar10;
          local_270.field_2._8_8_ = plVar7[3];
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        }
        else {
          local_270.field_2._M_allocated_capacity = *puVar10;
        }
        local_270._M_string_length = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
        local_290._M_dataplus._M_p = (pointer)*puVar8;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p == paVar15) {
          local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_290.field_2._8_8_ = puVar8[3];
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        }
        else {
          local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_290._M_string_length = puVar8[1];
        *puVar8 = paVar15;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_180._M_dataplus._M_p._0_4_ = 0x417;
        StreamableToString<int>(&local_230,(int *)&local_180);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          uVar18 = local_290.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            uVar18 = local_230.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length)
          goto LAB_0011a61f;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
        }
        else {
LAB_0011a61f:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
        }
        local_2f0 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_2f0 == puVar10) {
          local_2e0 = *puVar10;
          lStack_2d8 = puVar8[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar10;
        }
        local_2e8 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
        local_310 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_310 == puVar10) {
          local_300 = *puVar10;
          lStack_2f8 = puVar8[3];
          local_310 = &local_300;
        }
        else {
          local_300 = *puVar10;
        }
        local_308 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
        local_2d0 = &local_2c0;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if (paVar16 != paVar15) goto LAB_0011b339;
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c0._8_8_ = puVar8[3];
        goto LAB_0011b346;
      }
    }
    bVar2 = AlwaysTrue();
  } while (!bVar2);
  if (FLAGS_gtest_death_test_use_fork != '\0') {
    _Var4 = fork();
    if (_Var4 != 0) {
LAB_00119b92:
      do {
        while (iVar3 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)0x0), iVar3 == -1) {
          piVar9 = __errno_location();
          if (*piVar9 != 4) {
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_270._M_dataplus._M_p = (pointer)*puVar8;
            puVar10 = puVar8 + 2;
            if ((ulong *)local_270._M_dataplus._M_p == puVar10) {
              local_270.field_2._M_allocated_capacity = *puVar10;
              local_270.field_2._8_8_ = puVar8[3];
              local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            }
            else {
              local_270.field_2._M_allocated_capacity = *puVar10;
            }
            local_270._M_string_length = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
            local_290._M_dataplus._M_p = (pointer)*puVar8;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p == paVar15) {
              local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_290.field_2._8_8_ = puVar8[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            }
            local_290._M_string_length = puVar8[1];
            *puVar8 = paVar15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            local_180._M_dataplus._M_p._0_4_ = 0x441;
            StreamableToString<int>(&local_230,(int *)&local_180);
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              uVar18 = local_290.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length) {
              uVar18 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                uVar18 = local_230.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length)
              goto LAB_0011a6e0;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p)
              ;
            }
            else {
LAB_0011a6e0:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
            }
            local_2f0 = (ulong *)*puVar8;
            puVar10 = puVar8 + 2;
            if (local_2f0 == puVar10) {
              local_2e0 = *puVar10;
              lStack_2d8 = puVar8[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0 = *puVar10;
            }
            local_2e8 = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)puVar10 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
            local_310 = (ulong *)*puVar8;
            puVar10 = puVar8 + 2;
            if (local_310 == puVar10) {
              local_300 = *puVar10;
              lStack_2f8 = puVar8[3];
              local_310 = &local_300;
            }
            else {
              local_300 = *puVar10;
            }
            local_308 = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_2d0 == paVar15) {
              local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_2c0._8_8_ = puVar8[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
            }
            local_2c8 = puVar8[1];
            *puVar8 = paVar15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (paVar16 != paVar15) goto LAB_0011b51b;
            local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar8[3];
            goto LAB_0011b528;
          }
        }
        bVar2 = AlwaysTrue();
      } while (!bVar2);
LAB_00119c33:
      bVar2 = IsTrue(_Var4 != -1);
      if (bVar2) goto code_r0x00119c49;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)*plVar7;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar15) {
        local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_290.field_2._8_8_ = plVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_290._M_string_length = plVar7[1];
      *plVar7 = (long)paVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_2f0 == puVar10) {
        local_2e0 = *puVar10;
        lStack_2d8 = puVar8[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *puVar10;
      }
      local_2e8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x444;
      StreamableToString<int>(&local_250,(int *)&local_230);
      uVar17 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar17 = local_2e0;
      }
      if (uVar17 < local_250._M_string_length + local_2e8) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar18 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_250._M_string_length + local_2e8) goto LAB_0011a561;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_0011a561:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar8[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if (local_2d0 == paVar15) {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c0._8_8_ = plVar7[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2c8 = plVar7[1];
      *plVar7 = (long)paVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar8 = extraout_RAX_01;
      paVar16 = extraout_RDX_01;
LAB_0011b339:
      local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2d0 = paVar16;
LAB_0011b346:
      local_2c8 = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
LAB_0011b4ed:
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar8 = extraout_RAX_05;
      paVar16 = extraout_RDX_05;
LAB_0011b51b:
      local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2b0._M_dataplus._M_p = (pointer)paVar16;
LAB_0011b528:
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar8 = extraout_RAX_06;
      local_160 = extraout_RDX_06;
      goto LAB_0011b549;
    }
    ExecDeathTestChildMain(&local_1c0);
  }
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
    AssumeRole();
  }
  uVar5 = getpagesize();
  __len = (size_t)(int)uVar5;
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
LAB_00119ae6:
  bVar2 = IsTrue(__addr != (void *)0xffffffffffffffff);
  if (bVar2) goto code_r0x00119afd;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar15) {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_290.field_2._8_8_ = puVar8[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_290._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x423;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar17 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar17 = local_2e0;
  }
  if (uVar17 < local_250._M_string_length + local_2e8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar18 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_250._M_string_length + local_2e8) goto LAB_0011a835;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0011a835:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_0011b1e5:
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_02;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_02;
  goto LAB_0011b491;
code_r0x00119afd:
  bVar2 = AlwaysTrue();
  if (bVar2) goto code_r0x00119b06;
  goto LAB_00119ae6;
code_r0x00119b06:
  lVar14 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar14 = __len - 0x40;
  }
LAB_00119b30:
  bVar2 = IsTrue(((ulong)((long)__addr + lVar14) & 0x3f) == 0 && 0x40 < uVar5);
  if (bVar2) goto code_r0x00119b3f;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar15) {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_290.field_2._8_8_ = puVar8[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_290._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x430;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar17 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar17 = local_2e0;
  }
  if (uVar17 < local_250._M_string_length + local_2e8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar18 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_250._M_string_length + local_2e8) goto LAB_0011a8de;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0011a8de:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0011b491:
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_03;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_03;
  goto LAB_0011b4bf;
code_r0x00119b3f:
  bVar2 = AlwaysTrue();
  if (bVar2) goto code_r0x00119b48;
  goto LAB_00119b30;
code_r0x00119b48:
  _Var4 = clone(ExecDeathTestChildMain,(void *)((long)__addr + lVar14),0x11,&local_1c0);
LAB_00119b68:
  iVar3 = munmap(__addr,__len);
  bVar2 = IsTrue(iVar3 != -1);
  if (bVar2) goto code_r0x00119b89;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar15) {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_290.field_2._8_8_ = puVar8[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_290._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x434;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar17 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar17 = local_2e0;
  }
  if (uVar17 < local_250._M_string_length + local_2e8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar18 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_250._M_string_length + local_2e8) goto LAB_0011a987;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0011a987:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0011b4bf:
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_04;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
  goto LAB_0011b4ed;
code_r0x00119b89:
  bVar2 = AlwaysTrue();
  if (bVar2) goto LAB_00119b92;
  goto LAB_00119b68;
code_r0x00119c49:
  bVar2 = AlwaysTrue();
  if (bVar2) goto LAB_00119c62;
  goto LAB_00119c33;
LAB_00119c62:
  do {
    while (iVar3 = close(local_20c), iVar3 != -1) {
      bVar2 = AlwaysTrue();
      if (bVar2) {
        *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var4;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_210;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        Arguments::~Arguments((Arguments *)&local_1e8);
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        return OVERSEE_TEST;
      }
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_250._M_dataplus._M_p._0_4_ = 0x473;
  StreamableToString<int>(&local_270,(int *)&local_250);
  uVar17 = 0xf;
  if (local_310 != &local_300) {
    uVar17 = local_300;
  }
  if (uVar17 < local_270._M_string_length + local_308) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar18 = local_270.field_2._M_allocated_capacity;
    }
    if (local_270._M_string_length + local_308 <= (ulong)uVar18) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_310);
      goto LAB_0011acae;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_270._M_dataplus._M_p);
LAB_0011acae:
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar15) {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar15) {
    local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
  }
  else {
    local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
  }
  local_c0 = (undefined1  [8])puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  local_160.sa_handler = (__sighandler_t)*puVar8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler == paVar15) {
    local_150 = paVar15->_M_allocated_capacity;
    uStack_148 = puVar8[3];
    local_160.sa_handler = _Var19.sa_handler;
  }
  else {
LAB_0011b549:
    local_150 = paVar15->_M_allocated_capacity;
  }
  local_158 = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  if (local_160.sa_handler != _Var19.sa_handler) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_c0 + 8)) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_1e8);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}